

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTestSuite<phmap::priv::MembersTest,_testing::internal::Templates<phmap::priv::gtest_suite_MembersTest_::BeginEnd>,_testing::internal::Types<phmap::node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>,_phmap::node_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>,_phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>_>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  int iVar5;
  char *pcVar6;
  const_iterator cVar7;
  CodeLocation *pCVar8;
  undefined8 extraout_RAX;
  char *pcVar9;
  ulong uVar10;
  string test_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  char *local_b8;
  key_type local_b0;
  CodeLocation *local_90;
  char *local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  CodeLocation local_78;
  string local_50;
  
  local_b8 = case_name;
  local_90 = code_location;
  local_88 = prefix;
  local_80 = type_names;
  RegisterTypeParameterizedTestSuiteInstantiation(case_name);
  pcVar6 = strchr(test_names,0x2c);
  if (pcVar6 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,test_names,(allocator<char> *)&local_50);
  }
  else {
    local_d8 = &local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,test_names,pcVar6);
  }
  local_b0._M_dataplus._M_p = (pointer)local_d8;
  if (local_d0 != 0) {
    pcVar6 = local_d8->_M_local_buf + local_d0;
    do {
      paVar2 = local_d8;
      iVar5 = isspace((uint)(byte)pcVar6[-1]);
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      if (iVar5 == 0) break;
      pcVar9 = pcVar6 + -1;
      uVar10 = (long)pcVar9 - (long)paVar2;
      std::__cxx11::string::_M_erase((ulong)&local_d8,uVar10);
      pcVar6 = local_d8->_M_local_buf + uVar10;
      local_b0._M_dataplus._M_p = (pointer)local_d8;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar9 != paVar2);
  }
  paVar2 = &local_b0.field_2;
  local_d8 = &local_c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == local_d8) {
    local_b0.field_2._8_8_ = local_c8._8_8_;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
  }
  local_b0.field_2._M_allocated_capacity._1_7_ = local_c8._M_allocated_capacity._1_7_;
  local_b0.field_2._M_local_buf[0] = local_c8._M_local_buf[0];
  local_b0._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
          ::find(&(state->registered_tests_)._M_t,&local_b0);
  p_Var1 = &(state->registered_tests_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
    FormatFileLocation_abi_cxx11_
              (&local_50,(internal *)(local_90->file)._M_dataplus._M_p,
               (char *)(ulong)(uint)local_90->line,(int)p_Var1);
    TypeParameterizedTestSuite<phmap::priv::MembersTest,testing::internal::Templates<phmap::priv::gtest_suite_MembersTest_::BeginEnd>,testing::internal::Types<phmap::node_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>,phmap::node_hash_set<std::__cxx11::string,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>>,phmap::node_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>,phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>>>
    ::Register();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  pCVar8 = TypedTestSuitePState::GetCodeLocation(state,&local_b0);
  paVar3 = &local_78.file.field_2;
  pcVar4 = (pCVar8->file)._M_dataplus._M_p;
  local_78.file._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar4,pcVar4 + (pCVar8->file)._M_string_length);
  local_78.line = pCVar8->line;
  TypeParameterizedTest<phmap::priv::MembersTest,_testing::internal::TemplateSel<phmap::priv::gtest_suite_MembersTest_::BeginEnd>,_testing::internal::Types<phmap::node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>,_phmap::node_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>,_phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>_>_>
  ::Register(local_88,&local_78,local_b8,test_names,0,local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar3) {
    operator_delete(local_78.file._M_dataplus._M_p,local_78.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }